

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_scalingFactorBetweenUnitsSameNameDifferentDefinitions_Test::
~Units_scalingFactorBetweenUnitsSameNameDifferentDefinitions_Test
          (Units_scalingFactorBetweenUnitsSameNameDifferentDefinitions_Test *this)

{
  Units_scalingFactorBetweenUnitsSameNameDifferentDefinitions_Test *this_local;
  
  ~Units_scalingFactorBetweenUnitsSameNameDifferentDefinitions_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, scalingFactorBetweenUnitsSameNameDifferentDefinitions)
{
    auto model1 = libcellml::Model::create("model1");
    auto u1 = libcellml::Units::create("units");
    u1->addUnit("second", "milli");
    model1->addUnits(u1);

    auto u2 = libcellml::Units::create("units");
    u2->addUnit("volt");

    auto scaling = libcellml::Units::scalingFactor(u1, u2);
    EXPECT_EQ(0.0, scaling);
}